

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O1

void __thiscall xscript::tokenizer::scanner::step_to_eonb(scanner *this)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (this->source)._M_len;
  if (this->offset < uVar1) {
    pcVar2 = (this->source)._M_str;
    uVar3 = this->offset;
    do {
      uVar4 = uVar3 + 1;
      if ((pcVar2[uVar3] & 0xfeU) != 0x30) {
        return;
      }
      this->offset = uVar4;
      uVar3 = uVar4;
    } while (uVar4 != uVar1);
  }
  return;
}

Assistant:

void scanner::step_to_eonb() {
    while (offset < source.length()) {
        char n = source.at(offset);
        if ( n >= '0' && n <= '1' ) {
            offset++;
        } else {
            break;
        }
    }
}